

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O1

void __thiscall FatSystem::enableWrite(FatSystem *this)

{
  int iVar1;
  ostream *poVar2;
  undefined8 uVar3;
  ostringstream oss;
  ostringstream aoStack_188 [376];
  
  close(this->fd);
  iVar1 = open((this->filename)._M_dataplus._M_p,2);
  this->fd = iVar1;
  if (-1 < iVar1) {
    this->writeMode = true;
    return;
  }
  std::__cxx11::ostringstream::ostringstream(aoStack_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,"! Unable to open the input file: ",0x21);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)aoStack_188,(this->filename)._M_dataplus._M_p,
                      (this->filename)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," for writing",0xc);
  uVar3 = __cxa_allocate_exception(0x20);
  std::__cxx11::stringbuf::str();
  __cxa_throw(uVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void FatSystem::enableWrite()
{
    close(fd);
    fd = open(filename.c_str(), O_RDWR|O_LARGEFILE);

    if (fd < 0) {
        ostringstream oss;
        oss << "! Unable to open the input file: " << filename << " for writing";

        throw oss.str();
    }

    writeMode = true;
}